

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_char_t * cf_strcpy_s(cf_char_t *dst,cf_size_t dstsize,cf_char_t *src)

{
  cf_size_t cVar1;
  cf_void_t *pcVar2;
  cf_size_t srcsize;
  cf_char_t *src_local;
  cf_size_t dstsize_local;
  cf_char_t *dst_local;
  
  if ((dst == (cf_char_t *)0x0) || (src == (cf_char_t *)0x0)) {
    dst_local = (cf_char_t *)0x0;
  }
  else {
    cVar1 = cf_strlen(src);
    if (dstsize < cVar1 + 1) {
      dst_local = (cf_char_t *)0x0;
    }
    else {
      pcVar2 = cf_memcpy_s(dst,dstsize,src,cVar1 + 1);
      dst_local = dst;
      if (pcVar2 == (cf_void_t *)0x0) {
        dst_local = (cf_char_t *)0x0;
      }
    }
  }
  return dst_local;
}

Assistant:

cf_char_t* cf_strcpy_s(cf_char_t* dst, cf_size_t dstsize, const cf_char_t* src) {
    cf_size_t srcsize;
    if(!dst || !src) return CF_NULL_PTR;

    srcsize = cf_strlen(src) + 1;
    if(srcsize > dstsize) return CF_NULL_PTR;
    if(!cf_memcpy_s(dst, dstsize, src, srcsize)) return CF_NULL_PTR;
    return dst;
}